

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset(raw_quasi_adaptive_huffman_data_model *this)

{
  bool bVar1;
  unsigned_short *puVar2;
  raw_quasi_adaptive_huffman_data_model *in_RDI;
  uint i;
  uint local_14;
  bool local_1;
  
  if (in_RDI->m_total_syms == 0) {
    local_1 = true;
  }
  else {
    for (local_14 = 0; local_14 < in_RDI->m_total_syms; local_14 = local_14 + 1) {
      puVar2 = vector<unsigned_short>::operator[](&in_RDI->m_sym_freq,local_14);
      *puVar2 = 1;
    }
    in_RDI->m_total_count = 0;
    in_RDI->m_update_cycle = in_RDI->m_total_syms;
    bVar1 = update(in_RDI);
    if (bVar1) {
      in_RDI->m_update_cycle = 8;
      in_RDI->m_symbols_until_update = 8;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::reset()
   {
      if (!m_total_syms)
         return true;

      for (uint i = 0; i < m_total_syms; i++)
         m_sym_freq[i] = 1;

      m_total_count = 0;
      m_update_cycle = m_total_syms;

      if (!update())
         return false;

      m_symbols_until_update = m_update_cycle = 8;
      return true;
   }